

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O0

vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_> *
ctemplate::GetModifierForXml
          (vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
           *__return_storage_ptr__,HtmlParser *htmlparser,string *error_msg)

{
  string *error_msg_local;
  HtmlParser *htmlparser_local;
  vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  *modvals;
  
  std::
  vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  ::vector(__return_storage_ptr__);
  std::
  vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  ::push_back(__return_storage_ptr__,(value_type *)(g_am_dirs + 0x40));
  return __return_storage_ptr__;
}

Assistant:

vector<const ModifierAndValue*> GetModifierForXml(HtmlParser* htmlparser,
                                                        string* error_msg) {
  vector<const ModifierAndValue*> modvals;
  modvals.push_back(g_am_dirs[AM_XML]);
  return modvals;
}